

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O3

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::~rasterizer_cells_aa
          (rasterizer_cells_aa<agg::cell_aa> *this)

{
  uint uVar1;
  sorted_y *psVar2;
  cell_aa **ppcVar3;
  uint uVar4;
  cell_type **ppcVar5;
  bool bVar6;
  
  uVar1 = this->m_num_blocks;
  if ((ulong)uVar1 != 0) {
    uVar4 = uVar1 - 1;
    this->m_num_blocks = uVar4;
    ppcVar5 = this->m_cells + uVar1;
    do {
      ppcVar5 = ppcVar5 + -1;
      if (*ppcVar5 != (cell_type *)0x0) {
        operator_delete__(*ppcVar5);
        uVar4 = this->m_num_blocks;
      }
      bVar6 = uVar4 != 0;
      uVar4 = uVar4 - 1;
      this->m_num_blocks = uVar4;
    } while (bVar6);
    if (this->m_cells != (cell_type **)0x0) {
      operator_delete__(this->m_cells);
    }
  }
  psVar2 = (this->m_sorted_y).m_array;
  if (psVar2 != (sorted_y *)0x0) {
    operator_delete__(psVar2);
  }
  ppcVar3 = (this->m_sorted_cells).m_array;
  if (ppcVar3 != (cell_aa **)0x0) {
    operator_delete__(ppcVar3);
    return;
  }
  return;
}

Assistant:

rasterizer_cells_aa<Cell>::~rasterizer_cells_aa()
    {
        if(m_num_blocks)
        {
            cell_type** ptr = m_cells + m_num_blocks - 1;
            while(m_num_blocks--)
            {
                pod_allocator<cell_type>::deallocate(*ptr, cell_block_size);
                ptr--;
            }
            pod_allocator<cell_type*>::deallocate(m_cells, m_max_blocks);
        }
    }